

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.c
# Opt level: O0

void quest_talk(monst *mtmp)

{
  uchar uVar1;
  monst *mtmp_local;
  
  if (mtmp->m_id == quest_status.leader_m_id) {
    leader_speaks(mtmp);
  }
  else {
    uVar1 = mtmp->data->msound;
    if (uVar1 == '\x18') {
      prisoner_speaks(mtmp);
    }
    else if (uVar1 == ' ') {
      nemesis_speaks();
    }
  }
  return;
}

Assistant:

void quest_talk(struct monst *mtmp)
{
    if (mtmp->m_id == Qstat(leader_m_id)) {
	leader_speaks(mtmp);
	return;
    }
    switch(mtmp->data->msound) {
	    case MS_NEMESIS:	nemesis_speaks(); break;
	    case MS_DJINNI:	prisoner_speaks(mtmp); break;
	    default:		break;
	}
}